

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_serialize_to_buffer(JSON_Value *value,char *buf,size_t buf_size_in_bytes)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = json_serialization_size(value);
  if (sVar2 - 1 < buf_size_in_bytes) {
    iVar1 = json_serialize_to_buffer_r(value,buf,0,0,(char *)0x0);
    iVar1 = iVar1 >> 0x1f;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

JSON_Status json_serialize_to_buffer(const JSON_Value *value, char *buf, size_t buf_size_in_bytes) {
    int written = -1;
    size_t needed_size_in_bytes = json_serialization_size(value);
    if (needed_size_in_bytes == 0 || buf_size_in_bytes < needed_size_in_bytes) {
        return JSONFailure;
    }
    written = json_serialize_to_buffer_r(value, buf, 0, PARSON_FALSE, NULL);
    if (written < 0) {
        return JSONFailure;
    }
    return JSONSuccess;
}